

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bernstein_polynomial.cpp
# Opt level: O3

double r8mat_is_identity(int n,double *a)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = 0.0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
    uVar2 = 0;
    pdVar3 = a;
    do {
      uVar5 = 0;
      pdVar4 = pdVar3;
      do {
        if (uVar2 == uVar5) {
          dVar7 = a[uVar2 * (uVar1 + 1)] + -1.0;
        }
        else {
          dVar7 = *pdVar4;
        }
        dVar6 = dVar6 + dVar7 * dVar7;
        uVar5 = uVar5 + 1;
        pdVar4 = pdVar4 + uVar1;
      } while (uVar1 != uVar5);
      uVar2 = uVar2 + 1;
      pdVar3 = pdVar3 + 1;
    } while (uVar2 != uVar1);
  }
  if (0.0 <= dVar6) {
    return SQRT(dVar6);
  }
  dVar6 = sqrt(dVar6);
  return dVar6;
}

Assistant:

double r8mat_is_identity ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_IS_IDENTITY determines if an R8MAT is the identity.
//
//  Discussion:
//
//    An R8MAT is a matrix of real ( kind = 8 ) values.
//
//    The routine returns the Frobenius norm of A - I.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 July 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Input, double A[N*N], the matrix.
//
//    Output, double R8MAT_IS_IDENTITY, the Frobenius norm
//    of the difference matrix A - I, which would be exactly zero
//    if A were the identity matrix.
//
{
  double error_frobenius;
  int i;
  int j;
  double t;

  error_frobenius = 0.0;

  for ( i = 0; i < n; i++ )
  {
    for ( j = 0; j < n; j++ )
    {
      if ( i == j )
      {
        t = a[i+j*n] - 1.0;
      }
      else
      {
        t = a[i+j*n];
      }
      error_frobenius = error_frobenius + t * t;
    }
  }
  error_frobenius = sqrt ( error_frobenius );

  return error_frobenius;
}